

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_pbr(dill_stream_conflict s,int op_type,int data_type,dill_reg src1,dill_reg src2,int label
             )

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int index;
  
  if ((in_ESI < 0) || (5 < in_ESI)) {
    printf("Bad op type in dill_pbr\n");
  }
  iVar1 = in_EDX + in_ESI * 0xb;
  (**(code **)(*(long *)(*in_RDI + 0x78) + (long)iVar1 * 8))
            (in_RDI,(int)*(short *)(*(long *)(*in_RDI + 0x88) + (long)iVar1 * 4),
             (int)*(short *)(*(long *)(*in_RDI + 0x88) + 2 + (long)iVar1 * 4),in_ECX,in_R8D,in_R9D);
  return;
}

Assistant:

extern void
dill_pbr(dill_stream s,
         int op_type,
         int data_type,
         dill_reg src1,
         dill_reg src2,
         int label)
{
    int index;
    if ((op_type < dill_eq_code) || (op_type > dill_ne_code)) {
        printf("Bad op type in dill_pbr\n");
    }
    index = data_type + 11 * op_type;
    (s->j->jmp_b)[index](s, s->j->b_data[index].data1,
                         s->j->b_data[index].data2, src1, src2, label);
}